

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexPlaneCollisionAlgorithm.cpp
# Opt level: O3

void __thiscall
cbtConvexPlaneCollisionAlgorithm::collideSingleContact
          (cbtConvexPlaneCollisionAlgorithm *this,cbtQuaternion *perturbeRot,
          cbtCollisionObjectWrapper *body0Wrap,cbtCollisionObjectWrapper *body1Wrap,
          cbtDispatcherInfo *dispatchInfo,cbtManifoldResult *resultOut)

{
  cbtScalar cVar1;
  cbtScalar cVar2;
  cbtScalar cVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  cbtScalar cVar8;
  float fVar9;
  cbtScalar cVar10;
  cbtScalar cVar11;
  int iVar12;
  undefined4 uVar13;
  float fVar14;
  uint uVar15;
  uint uVar16;
  cbtCollisionShape *pcVar17;
  cbtTransform *pcVar18;
  cbtCollisionShape *pcVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  cbtCollisionObjectWrapper *pcVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  cbtScalar cVar47;
  cbtScalar acVar48 [4];
  float fVar49;
  undefined1 auVar50 [16];
  float fVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  cbtVector3 normalOnSurfaceB;
  cbtMatrix3x3 local_70;
  float local_40;
  float local_3c;
  float local_38;
  
  pcVar44 = body1Wrap;
  if (this->m_isSwapped != false) {
    pcVar44 = body0Wrap;
    body0Wrap = body1Wrap;
  }
  pcVar17 = body0Wrap->m_shape;
  pcVar18 = body0Wrap->m_worldTransform;
  pcVar19 = pcVar44->m_shape;
  fVar51 = (pcVar18->m_basis).m_el[0].m_floats[1];
  cVar1 = (pcVar18->m_basis).m_el[0].m_floats[0];
  cVar2 = (pcVar18->m_origin).m_floats[0];
  cVar3 = (pcVar18->m_basis).m_el[0].m_floats[2];
  fVar4 = (pcVar18->m_basis).m_el[1].m_floats[1];
  fVar5 = (pcVar18->m_basis).m_el[1].m_floats[0];
  fVar6 = (pcVar18->m_basis).m_el[1].m_floats[2];
  fVar7 = (pcVar18->m_basis).m_el[2].m_floats[1];
  cVar8 = (pcVar18->m_basis).m_el[2].m_floats[0];
  fVar9 = (pcVar18->m_origin).m_floats[1];
  cVar10 = (pcVar18->m_origin).m_floats[2];
  cVar11 = (pcVar18->m_basis).m_el[2].m_floats[2];
  cbtTransform::inverse(pcVar44->m_worldTransform);
  auVar50._4_4_ = cVar3;
  auVar50._0_4_ = cVar3;
  auVar50._8_4_ = cVar3;
  auVar50._12_4_ = cVar3;
  auVar32._4_4_ = cVar11;
  auVar32._0_4_ = cVar11;
  auVar32._8_4_ = cVar11;
  auVar32._12_4_ = cVar11;
  auVar33._4_4_ = fVar51;
  auVar33._0_4_ = fVar51;
  auVar33._8_4_ = fVar51;
  auVar33._12_4_ = fVar51;
  auVar34._4_4_ = fVar7;
  auVar34._0_4_ = fVar7;
  auVar34._8_4_ = fVar7;
  auVar34._12_4_ = fVar7;
  auVar35._4_4_ = fVar5;
  auVar35._0_4_ = fVar5;
  auVar35._8_4_ = fVar5;
  auVar35._12_4_ = fVar5;
  auVar31._4_4_ = cVar1;
  auVar31._0_4_ = cVar1;
  auVar31._8_4_ = cVar1;
  auVar31._12_4_ = cVar1;
  auVar36._4_4_ = cVar8;
  auVar36._0_4_ = cVar8;
  auVar36._8_4_ = cVar8;
  auVar36._12_4_ = cVar8;
  auVar45 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * local_70.m_el[0].m_floats[1])),auVar50,
                            ZEXT416((uint)local_70.m_el[0].m_floats[0]));
  auVar46 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * local_70.m_el[0].m_floats[1])),auVar33,
                            ZEXT416((uint)local_70.m_el[0].m_floats[0]));
  auVar59 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * local_70.m_el[0].m_floats[1])),auVar31,
                            ZEXT416((uint)local_70.m_el[0].m_floats[0]));
  auVar25 = vfmadd231ss_fma(auVar45,auVar32,ZEXT416((uint)local_70.m_el[0].m_floats[2]));
  auVar26 = vfmadd231ss_fma(auVar46,auVar34,ZEXT416((uint)local_70.m_el[0].m_floats[2]));
  auVar27 = vfmadd231ss_fma(auVar59,auVar36,ZEXT416((uint)local_70.m_el[0].m_floats[2]));
  auVar45 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar5 * local_70.m_el[1].m_floats[1])),auVar31,
                                ZEXT416((uint)local_70.m_el[1].m_floats[0]));
  auVar46 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar4 * local_70.m_el[1].m_floats[1])),auVar33,
                                ZEXT416((uint)local_70.m_el[1].m_floats[0]));
  auVar28 = vfmadd231ss_fma(auVar45,auVar36,ZEXT416((uint)local_70.m_el[1].m_floats[2]));
  auVar29 = vfmadd231ss_fma(auVar46,auVar34,ZEXT416((uint)local_70.m_el[1].m_floats[2]));
  auVar45 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar6 * local_70.m_el[1].m_floats[1])),auVar50,
                                ZEXT416((uint)local_70.m_el[1].m_floats[0]));
  auVar30 = vfmadd231ss_fma(auVar45,auVar32,ZEXT416((uint)local_70.m_el[1].m_floats[2]));
  auVar45 = vmulss_avx512f(auVar35,ZEXT416((uint)local_70.m_el[2].m_floats[1]));
  auVar45 = vfmadd231ss_avx512f(auVar45,auVar31,ZEXT416((uint)local_70.m_el[2].m_floats[0]));
  auVar46 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar6 * local_70.m_el[2].m_floats[1])),auVar50,
                                ZEXT416((uint)local_70.m_el[2].m_floats[0]));
  auVar31 = vfmadd231ss_fma(auVar45,auVar36,ZEXT416((uint)local_70.m_el[2].m_floats[2]));
  auVar32 = vfmadd231ss_fma(auVar46,auVar32,ZEXT416((uint)local_70.m_el[2].m_floats[2]));
  auVar45 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar4 * local_70.m_el[2].m_floats[1])),auVar33,
                                ZEXT416((uint)local_70.m_el[2].m_floats[0]));
  auVar33 = vfmadd231ss_fma(auVar45,auVar34,ZEXT416((uint)local_70.m_el[2].m_floats[2]));
  auVar45 = vfmadd231ss_fma(ZEXT416((uint)(fVar9 * local_70.m_el[0].m_floats[1])),
                            ZEXT416((uint)cVar2),ZEXT416((uint)local_70.m_el[0].m_floats[0]));
  auVar46 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar9 * local_70.m_el[1].m_floats[1])),
                                ZEXT416((uint)cVar2),ZEXT416((uint)local_70.m_el[1].m_floats[0]));
  auVar34 = vfmadd231ss_fma(auVar45,ZEXT416((uint)cVar10),
                            ZEXT416((uint)local_70.m_el[0].m_floats[2]));
  auVar45 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar9 * local_70.m_el[2].m_floats[1])),
                                ZEXT416((uint)cVar2),ZEXT416((uint)local_70.m_el[2].m_floats[0]));
  auVar35 = vfmadd231ss_fma(auVar46,ZEXT416((uint)cVar10),
                            ZEXT416((uint)local_70.m_el[1].m_floats[2]));
  auVar36 = vfmadd231ss_fma(auVar45,ZEXT416((uint)cVar10),
                            ZEXT416((uint)local_70.m_el[2].m_floats[2]));
  local_70.m_el[0].m_floats._0_12_ = local_70.m_el._8_12_;
  cbtMatrix3x3::setRotation(&local_70,perturbeRot);
  auVar40._4_4_ = cVar1;
  auVar40._0_4_ = cVar1;
  auVar40._8_4_ = cVar1;
  auVar40._12_4_ = cVar1;
  auVar42._4_4_ = fVar5;
  auVar42._0_4_ = fVar5;
  auVar42._8_4_ = fVar5;
  auVar42._12_4_ = fVar5;
  auVar43._4_4_ = cVar8;
  auVar43._0_4_ = cVar8;
  auVar43._8_4_ = cVar8;
  auVar43._12_4_ = cVar8;
  auVar38._4_4_ = cVar3;
  auVar38._0_4_ = cVar3;
  auVar38._8_4_ = cVar3;
  auVar38._12_4_ = cVar3;
  auVar39._4_4_ = fVar6;
  auVar39._0_4_ = fVar6;
  auVar39._8_4_ = fVar6;
  auVar39._12_4_ = fVar6;
  auVar41._4_4_ = cVar11;
  auVar41._0_4_ = cVar11;
  auVar41._8_4_ = cVar11;
  auVar41._12_4_ = cVar11;
  pcVar18 = pcVar44->m_worldTransform;
  fVar5 = (pcVar18->m_basis).m_el[1].m_floats[2];
  cVar1 = (pcVar18->m_basis).m_el[0].m_floats[2];
  auVar66._4_4_ = cVar1;
  auVar66._0_4_ = cVar1;
  auVar66._8_4_ = cVar1;
  auVar66._12_4_ = cVar1;
  auVar45 = vfmadd231ss_fma(ZEXT416((uint)(fVar51 * local_70.m_el[1].m_floats[2])),
                            ZEXT416((uint)local_70.m_el[0].m_floats[2]),auVar40);
  auVar46 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * local_70.m_el[1].m_floats[2])),
                            ZEXT416((uint)local_70.m_el[0].m_floats[2]),auVar42);
  auVar59 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * local_70.m_el[1].m_floats[2])),auVar43,
                            ZEXT416((uint)local_70.m_el[0].m_floats[2]));
  auVar53._8_8_ = 0;
  auVar53._0_4_ = local_70.m_el[0].m_floats[0];
  auVar53._4_4_ = local_70.m_el[0].m_floats[1];
  auVar37 = vfmadd231ss_fma(auVar45,ZEXT416((uint)local_70.m_el[2].m_floats[2]),auVar38);
  auVar50 = vfmadd231ss_fma(auVar46,ZEXT416((uint)local_70.m_el[2].m_floats[2]),auVar39);
  auVar52 = vfmadd231ss_fma(auVar59,auVar41,ZEXT416((uint)local_70.m_el[2].m_floats[2]));
  auVar45._0_4_ = fVar51 * local_70.m_el[1].m_floats[0];
  auVar45._4_4_ = fVar51 * local_70.m_el[1].m_floats[1];
  auVar45._8_4_ = fVar51 * 0.0;
  auVar45._12_4_ = fVar51 * 0.0;
  auVar45 = vfmadd231ps_fma(auVar45,auVar53,auVar40);
  auVar56._4_4_ = local_70.m_el[2].m_floats[1];
  auVar56._0_4_ = local_70.m_el[2].m_floats[0];
  auVar56._8_8_ = 0;
  auVar45 = vfmadd231ps_fma(auVar45,auVar56,auVar38);
  auVar59._0_4_ = fVar4 * local_70.m_el[1].m_floats[0];
  auVar59._4_4_ = fVar4 * local_70.m_el[1].m_floats[1];
  auVar59._8_4_ = fVar4 * 0.0;
  auVar59._12_4_ = fVar4 * 0.0;
  auVar46._0_4_ = fVar7 * local_70.m_el[1].m_floats[0];
  auVar46._4_4_ = fVar7 * local_70.m_el[1].m_floats[1];
  auVar46._8_4_ = fVar7 * 0.0;
  auVar46._12_4_ = fVar7 * 0.0;
  fVar51 = (pcVar18->m_basis).m_el[1].m_floats[1];
  cVar1 = (pcVar18->m_basis).m_el[0].m_floats[1];
  auVar64._4_4_ = cVar1;
  auVar64._0_4_ = cVar1;
  auVar64._8_4_ = cVar1;
  auVar64._12_4_ = cVar1;
  auVar46 = vfmadd231ps_fma(auVar46,auVar53,auVar43);
  auVar59 = vfmadd231ps_fma(auVar59,auVar53,auVar42);
  fVar4 = (pcVar18->m_basis).m_el[1].m_floats[0];
  cVar1 = (pcVar18->m_basis).m_el[2].m_floats[0];
  auVar61._4_4_ = cVar1;
  auVar61._0_4_ = cVar1;
  auVar61._8_4_ = cVar1;
  auVar61._12_4_ = cVar1;
  auVar59 = vfmadd231ps_fma(auVar59,auVar56,auVar39);
  auVar46 = vfmadd231ps_fma(auVar46,auVar56,auVar41);
  cVar1 = (pcVar18->m_basis).m_el[0].m_floats[0];
  auVar57._4_4_ = cVar1;
  auVar57._0_4_ = cVar1;
  auVar57._8_4_ = cVar1;
  auVar57._12_4_ = cVar1;
  cVar1 = (pcVar18->m_basis).m_el[2].m_floats[1];
  auVar65._4_4_ = cVar1;
  auVar65._0_4_ = cVar1;
  auVar65._8_4_ = cVar1;
  auVar65._12_4_ = cVar1;
  fVar6 = auVar59._0_4_;
  auVar63._0_4_ = fVar51 * fVar6;
  fVar7 = auVar59._4_4_;
  auVar63._4_4_ = fVar51 * fVar7;
  fVar9 = auVar59._8_4_;
  auVar63._8_4_ = fVar51 * fVar9;
  fVar23 = auVar59._12_4_;
  auVar63._12_4_ = fVar51 * fVar23;
  auVar62._0_4_ = fVar6 * fVar4;
  auVar62._4_4_ = fVar7 * fVar4;
  auVar62._8_4_ = fVar9 * fVar4;
  auVar62._12_4_ = fVar23 * fVar4;
  fVar49 = auVar50._0_4_;
  auVar60._0_4_ = fVar5 * fVar6;
  auVar60._4_4_ = fVar5 * fVar7;
  auVar60._8_4_ = fVar5 * fVar9;
  auVar60._12_4_ = fVar5 * fVar23;
  auVar59 = vfmadd231ps_fma(auVar63,auVar64,auVar45);
  auVar50 = vfmadd231ps_fma(auVar60,auVar66,auVar45);
  auVar45 = vfmadd231ps_fma(auVar62,auVar57,auVar45);
  auVar38 = vfmadd231ss_fma(ZEXT416((uint)(fVar49 * fVar4)),auVar37,auVar57);
  cVar1 = (pcVar18->m_basis).m_el[2].m_floats[2];
  auVar54._4_4_ = cVar1;
  auVar54._0_4_ = cVar1;
  auVar54._8_4_ = cVar1;
  auVar54._12_4_ = cVar1;
  iVar12 = pcVar19[2].m_shapeType;
  auVar58._4_4_ = iVar12;
  auVar58._0_4_ = iVar12;
  auVar58._8_4_ = iVar12;
  auVar58._12_4_ = iVar12;
  auVar59 = vfmadd231ps_fma(auVar59,auVar65,auVar46);
  auVar45 = vfmadd231ps_fma(auVar45,auVar61,auVar46);
  auVar38 = vfmadd231ss_fma(auVar38,auVar52,auVar61);
  auVar39 = vfmadd231ss_fma(ZEXT416((uint)(fVar51 * fVar49)),auVar37,auVar64);
  auVar37 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar49)),auVar66,auVar37);
  fVar51 = *(float *)((long)&pcVar19[2]._vptr_cbtCollisionShape + 4);
  auVar46 = vfmadd231ps_fma(auVar50,auVar54,auVar46);
  auVar50 = vfmadd231ss_fma(auVar37,auVar54,auVar52);
  auVar37 = vfmadd231ss_fma(auVar39,auVar52,auVar65);
  uVar13 = *(undefined4 *)&pcVar19[2]._vptr_cbtCollisionShape;
  auVar52._4_4_ = uVar13;
  auVar52._0_4_ = uVar13;
  auVar52._8_4_ = uVar13;
  auVar52._12_4_ = uVar13;
  auVar55._0_4_ = auVar59._0_4_ * fVar51;
  auVar55._4_4_ = auVar59._4_4_ * fVar51;
  auVar55._8_4_ = auVar59._8_4_ * fVar51;
  auVar55._12_4_ = auVar59._12_4_ * fVar51;
  auVar45 = vfnmsub231ps_fma(auVar55,auVar52,auVar45);
  auVar59 = vfnmsub231ss_fma(ZEXT416((uint)(auVar37._0_4_ * fVar51)),auVar52,auVar38);
  auVar45 = vfnmadd231ps_fma(auVar45,auVar58,auVar46);
  auVar46 = vfnmadd231ss_fma(auVar59,auVar58,auVar50);
  acVar48 = (cbtScalar  [4])vinsertps_avx(auVar45,auVar46,0x28);
  local_70.m_el[0].m_floats = acVar48;
  (*pcVar17->_vptr_cbtCollisionShape[0x10])(pcVar17,&local_70);
  auVar45 = vmovshdup_avx((undefined1  [16])acVar48);
  fVar51 = auVar45._0_4_;
  pcVar18 = pcVar44->m_worldTransform;
  auVar45 = vfmadd231ss_fma(ZEXT416((uint)(fVar51 * auVar26._0_4_)),(undefined1  [16])acVar48,
                            ZEXT416(auVar27._0_4_));
  auVar45 = vfmadd231ss_fma(auVar45,auVar50,ZEXT416(auVar25._0_4_));
  fVar20 = auVar45._0_4_ + auVar34._0_4_ + local_40;
  auVar45 = vfmadd231ss_fma(ZEXT416((uint)(fVar51 * auVar29._0_4_)),(undefined1  [16])acVar48,
                            ZEXT416(auVar28._0_4_));
  auVar46 = vfmadd231ss_fma(ZEXT416((uint)(fVar51 * auVar33._0_4_)),(undefined1  [16])acVar48,
                            ZEXT416(auVar31._0_4_));
  fVar51 = *(float *)((long)&pcVar19[2]._vptr_cbtCollisionShape + 4);
  auVar45 = vfmadd231ss_fma(auVar45,auVar50,ZEXT416(auVar30._0_4_));
  auVar46 = vfmadd231ss_fma(auVar46,auVar50,ZEXT416(auVar32._0_4_));
  fVar21 = auVar45._0_4_ + auVar35._0_4_ + local_3c;
  fVar22 = auVar46._0_4_ + auVar36._0_4_ + local_38;
  fVar4 = *(float *)&pcVar19[2]._vptr_cbtCollisionShape;
  fVar5 = (float)pcVar19[2].m_shapeType;
  auVar45 = vfmadd231ss_fma(ZEXT416((uint)(fVar51 * fVar21)),ZEXT416((uint)fVar4),
                            ZEXT416((uint)fVar20));
  auVar45 = vfmadd231ss_fma(auVar45,ZEXT416((uint)fVar5),ZEXT416((uint)fVar22));
  fVar24 = auVar45._0_4_ - *(float *)&pcVar19[2].m_userPointer;
  cVar1 = (pcVar18->m_basis).m_el[0].m_floats[0];
  fVar6 = (pcVar18->m_basis).m_el[0].m_floats[1];
  cVar2 = (pcVar18->m_basis).m_el[0].m_floats[2];
  cVar3 = (pcVar18->m_basis).m_el[1].m_floats[0];
  fVar7 = (pcVar18->m_basis).m_el[1].m_floats[1];
  cVar8 = (pcVar18->m_basis).m_el[1].m_floats[2];
  cVar10 = (pcVar18->m_basis).m_el[2].m_floats[0];
  fVar9 = (pcVar18->m_basis).m_el[2].m_floats[1];
  cVar11 = (pcVar18->m_basis).m_el[2].m_floats[2];
  fVar23 = (pcVar18->m_origin).m_floats[0];
  fVar49 = (pcVar18->m_origin).m_floats[1];
  fVar14 = (pcVar18->m_origin).m_floats[2];
  cVar47 = cbtPersistentManifold::getContactBreakingThreshold(this->m_manifoldPtr);
  resultOut->m_manifoldPtr = this->m_manifoldPtr;
  if (fVar24 < cVar47) {
    pcVar18 = pcVar44->m_worldTransform;
    fVar22 = fVar22 - fVar24 * fVar5;
    fVar20 = fVar20 - fVar24 * fVar4;
    fVar21 = fVar21 - fVar24 * fVar51;
    auVar45 = vfmadd213ss_fma(ZEXT416((uint)cVar10),ZEXT416((uint)fVar20),
                              ZEXT416((uint)(fVar21 * fVar9)));
    auVar46 = vfmadd213ss_fma(ZEXT416((uint)cVar11),ZEXT416((uint)fVar22),auVar45);
    auVar45 = vfmadd213ss_fma(ZEXT416((uint)cVar1),ZEXT416((uint)fVar20),
                              ZEXT416((uint)(fVar21 * fVar6)));
    auVar45 = vfmadd213ss_fma(ZEXT416((uint)cVar2),ZEXT416((uint)fVar22),auVar45);
    auVar59 = vfmadd213ss_fma(ZEXT416((uint)cVar3),ZEXT416((uint)fVar20),
                              ZEXT416((uint)(fVar21 * fVar7)));
    fVar51 = *(float *)((long)&pcVar19[2]._vptr_cbtCollisionShape + 4);
    auVar59 = vfmadd213ss_fma(ZEXT416((uint)cVar8),ZEXT416((uint)fVar22),auVar59);
    uVar15 = *(uint *)&pcVar19[2]._vptr_cbtCollisionShape;
    auVar50 = vfmadd231ss_fma(ZEXT416((uint)(fVar51 * (pcVar18->m_basis).m_el[1].m_floats[1])),
                              ZEXT416(uVar15),ZEXT416((uint)(pcVar18->m_basis).m_el[1].m_floats[0]))
    ;
    auVar45 = vinsertps_avx(ZEXT416((uint)(auVar45._0_4_ + fVar23)),
                            ZEXT416((uint)(auVar59._0_4_ + fVar49)),0x10);
    uVar16 = pcVar19[2].m_shapeType;
    vinsertps_avx(auVar45,ZEXT416((uint)(auVar46._0_4_ + fVar14)),0x28);
    auVar45 = vfmadd231ss_fma(auVar50,ZEXT416(uVar16),
                              ZEXT416((uint)(pcVar18->m_basis).m_el[1].m_floats[2]));
    auVar46 = vfmadd231ss_fma(ZEXT416((uint)(fVar51 * (pcVar18->m_basis).m_el[0].m_floats[1])),
                              ZEXT416(uVar15),ZEXT416((uint)(pcVar18->m_basis).m_el[0].m_floats[0]))
    ;
    auVar59 = vfmadd231ss_fma(ZEXT416((uint)(fVar51 * (pcVar18->m_basis).m_el[2].m_floats[1])),
                              ZEXT416(uVar15),ZEXT416((uint)(pcVar18->m_basis).m_el[2].m_floats[0]))
    ;
    auVar46 = vfmadd231ss_fma(auVar46,ZEXT416(uVar16),
                              ZEXT416((uint)(pcVar18->m_basis).m_el[0].m_floats[2]));
    auVar59 = vfmadd231ss_fma(auVar59,ZEXT416(uVar16),
                              ZEXT416((uint)(pcVar18->m_basis).m_el[2].m_floats[2]));
    auVar45 = vinsertps_avx(auVar46,auVar45,0x10);
    local_70.m_el[0].m_floats = (cbtScalar  [4])vinsertps_avx(auVar45,auVar59,0x28);
    (*(resultOut->super_Result)._vptr_Result[4])((ulong)(uint)fVar24);
  }
  return;
}

Assistant:

void cbtConvexPlaneCollisionAlgorithm::collideSingleContact(const cbtQuaternion& perturbeRot, const cbtCollisionObjectWrapper* body0Wrap, const cbtCollisionObjectWrapper* body1Wrap, const cbtDispatcherInfo& dispatchInfo, cbtManifoldResult* resultOut)
{
	const cbtCollisionObjectWrapper* convexObjWrap = m_isSwapped ? body1Wrap : body0Wrap;
	const cbtCollisionObjectWrapper* planeObjWrap = m_isSwapped ? body0Wrap : body1Wrap;

	cbtConvexShape* convexShape = (cbtConvexShape*)convexObjWrap->getCollisionShape();
	cbtStaticPlaneShape* planeShape = (cbtStaticPlaneShape*)planeObjWrap->getCollisionShape();

	bool hasCollision = false;
	const cbtVector3& planeNormal = planeShape->getPlaneNormal();
	const cbtScalar& planeConstant = planeShape->getPlaneConstant();

	cbtTransform convexWorldTransform = convexObjWrap->getWorldTransform();
	cbtTransform convexInPlaneTrans;
	convexInPlaneTrans = planeObjWrap->getWorldTransform().inverse() * convexWorldTransform;
	//now perturbe the convex-world transform
	convexWorldTransform.getBasis() *= cbtMatrix3x3(perturbeRot);
	cbtTransform planeInConvex;
	planeInConvex = convexWorldTransform.inverse() * planeObjWrap->getWorldTransform();

	cbtVector3 vtx = convexShape->localGetSupportingVertex(planeInConvex.getBasis() * -planeNormal);

	cbtVector3 vtxInPlane = convexInPlaneTrans(vtx);
	cbtScalar distance = (planeNormal.dot(vtxInPlane) - planeConstant);

	cbtVector3 vtxInPlaneProjected = vtxInPlane - distance * planeNormal;
	cbtVector3 vtxInPlaneWorld = planeObjWrap->getWorldTransform() * vtxInPlaneProjected;

	hasCollision = distance < m_manifoldPtr->getContactBreakingThreshold();
	resultOut->setPersistentManifold(m_manifoldPtr);
	if (hasCollision)
	{
		/// report a contact. internally this will be kept persistent, and contact reduction is done
		cbtVector3 normalOnSurfaceB = planeObjWrap->getWorldTransform().getBasis() * planeNormal;
		cbtVector3 pOnB = vtxInPlaneWorld;
		resultOut->addContactPoint(normalOnSurfaceB, pOnB, distance);
	}
}